

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::IfcArbitraryClosedProfileDef
          (IfcArbitraryClosedProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcArbitraryClosedProfileDef *this_local;
  
  IfcProfileDef::IfcProfileDef(&this->super_IfcProfileDef,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef,_1UL> *)
             &(this->super_IfcProfileDef).field_0x58,vtt + 5);
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcProfileDef).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                  [-3]) = vtt[7];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = vtt[8];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcProfileDef).field_0x68,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcArbitraryClosedProfileDef() : Object("IfcArbitraryClosedProfileDef") {}